

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int ptls_log_add_fd(int fd,float sample_ratio,char *_points,char *_snis,char *_addresses,int appdata
                   )

{
  undefined8 *puVar1;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  char *__ptr;
  char *__ptr_00;
  size_t sVar5;
  void *__ptr_01;
  char *pcVar6;
  long lVar7;
  size_t sVar8;
  undefined1 auVar9 [16];
  in_addr v4;
  
  pthread_mutex_lock((pthread_mutex_t *)&logctx.mutex);
  __ptr = duplicate_stringlist(_points);
  if ((__ptr == (char *)0x0) || (__ptr_00 = duplicate_stringlist(_snis), __ptr_00 == (char *)0x0)) {
    __ptr_00 = (char *)0x0;
  }
  else {
    sVar8 = 0x10;
    for (pcVar6 = _addresses; (pcVar6 != (char *)0x0 && (*pcVar6 != '\0'));
        pcVar6 = pcVar6 + sVar5 + 1) {
      sVar5 = strlen(pcVar6);
      sVar8 = sVar8 + 0x10;
    }
    __ptr_01 = malloc(sVar8);
    if (__ptr_01 != (void *)0x0) {
      lVar7 = 0;
      for (; (_addresses != (char *)0x0 && (*_addresses != '\0'));
          _addresses = _addresses + sVar8 + 1) {
        pcVar6 = (char *)(lVar7 * 0x10 + (long)__ptr_01);
        iVar4 = inet_pton(10,_addresses,pcVar6);
        if (iVar4 == 0) {
          iVar4 = inet_pton(2,_addresses,&v4);
          if (iVar4 != 0) {
            pcVar6[0] = '\0';
            pcVar6[1] = '\0';
            pcVar6[2] = '\0';
            pcVar6[3] = '\0';
            pcVar6[4] = '\0';
            pcVar6[5] = '\0';
            pcVar6[6] = '\0';
            pcVar6[7] = '\0';
            pcVar6[8] = '\0';
            pcVar6[9] = '\0';
            pcVar6[10] = -1;
            pcVar6[0xb] = -1;
            *(in_addr_t *)(pcVar6 + 0xc) = v4.s_addr;
            goto LAB_00114f4e;
          }
        }
        else {
LAB_00114f4e:
          auVar9[0] = -(*pcVar6 == in6addr_any);
          auVar9[1] = -(pcVar6[1] == cRam00000000001353a9);
          auVar9[2] = -(pcVar6[2] == cRam00000000001353aa);
          auVar9[3] = -(pcVar6[3] == cRam00000000001353ab);
          auVar9[4] = -(pcVar6[4] == cRam00000000001353ac);
          auVar9[5] = -(pcVar6[5] == cRam00000000001353ad);
          auVar9[6] = -(pcVar6[6] == cRam00000000001353ae);
          auVar9[7] = -(pcVar6[7] == cRam00000000001353af);
          auVar9[8] = -((code)pcVar6[8] == EVP_aes_128_ecb);
          auVar9[9] = -(pcVar6[9] == cRam00000000001353b1);
          auVar9[10] = -(pcVar6[10] == cRam00000000001353b2);
          auVar9[0xb] = -(pcVar6[0xb] == cRam00000000001353b3);
          auVar9[0xc] = -(pcVar6[0xc] == cRam00000000001353b4);
          auVar9[0xd] = -(pcVar6[0xd] == cRam00000000001353b5);
          auVar9[0xe] = -(pcVar6[0xe] == cRam00000000001353b6);
          auVar9[0xf] = -(pcVar6[0xf] == cRam00000000001353b7);
          lVar7 = lVar7 + (ulong)((ushort)((ushort)(SUB161(auVar9 >> 7,0) & 1) |
                                           (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1 |
                                           (ushort)(SUB161(auVar9 >> 0x17,0) & 1) << 2 |
                                           (ushort)(SUB161(auVar9 >> 0x1f,0) & 1) << 3 |
                                           (ushort)(SUB161(auVar9 >> 0x27,0) & 1) << 4 |
                                           (ushort)(SUB161(auVar9 >> 0x2f,0) & 1) << 5 |
                                           (ushort)(SUB161(auVar9 >> 0x37,0) & 1) << 6 |
                                           (ushort)(SUB161(auVar9 >> 0x3f,0) & 1) << 7 |
                                           (ushort)(SUB161(auVar9 >> 0x47,0) & 1) << 8 |
                                           (ushort)(SUB161(auVar9 >> 0x4f,0) & 1) << 9 |
                                           (ushort)(SUB161(auVar9 >> 0x57,0) & 1) << 10 |
                                           (ushort)(SUB161(auVar9 >> 0x5f,0) & 1) << 0xb |
                                           (ushort)(SUB161(auVar9 >> 0x67,0) & 1) << 0xc |
                                           (ushort)(SUB161(auVar9 >> 0x6f,0) & 1) << 0xd |
                                           (ushort)(SUB161(auVar9 >> 0x77,0) & 1) << 0xe |
                                          (ushort)(auVar9[0xf] >> 7) << 0xf) != 0xffff);
        }
        sVar8 = strlen(_addresses);
      }
      uVar2 = CONCAT17(cRam00000000001353b7,
                       CONCAT16(cRam00000000001353b6,
                                CONCAT15(cRam00000000001353b5,
                                         CONCAT14(cRam00000000001353b4,
                                                  CONCAT13(cRam00000000001353b3,
                                                           CONCAT12(cRam00000000001353b2,
                                                                    CONCAT11(cRam00000000001353b1,
                                                                             EVP_aes_128_ecb)))))));
      puVar1 = (undefined8 *)((long)__ptr_01 + lVar7 * 0x10);
      *puVar1 = CONCAT17(cRam00000000001353af,
                         CONCAT16(cRam00000000001353ae,
                                  CONCAT15(cRam00000000001353ad,
                                           CONCAT14(cRam00000000001353ac,
                                                    CONCAT13(cRam00000000001353ab,
                                                             CONCAT12(cRam00000000001353aa,
                                                                      CONCAT11(cRam00000000001353a9,
                                                                               in6addr_any)))))));
      puVar1[1] = uVar2;
      iVar4 = 0x201;
      for (lVar7 = 0x24; lVar7 != 0x524; lVar7 = lVar7 + 0x28) {
        if (*(long *)((long)ptls_openssl_hpke_cipher_suites + lVar7 + 0x14) == 0) {
          *(int *)((long)ptls_openssl_hpke_cipher_suites + lVar7 + 0xc) = fd;
          *(char **)((long)ptls_openssl_hpke_cipher_suites + lVar7 + 0x14) = __ptr;
          *(char **)((long)ptls_openssl_hpke_cipher_suites + lVar7 + 0x1c) = __ptr_00;
          *(void **)((long)ptls_openssl_hpke_cipher_suites + lVar7 + 0x24) = __ptr_01;
          *(float *)(lVar7 + 0x13473c) = sample_ratio;
          *(byte *)((long)&logctx.conns[0].fd + lVar7) =
               *(byte *)((long)&logctx.conns[0].fd + lVar7) & 0xfe | (byte)appdata & 1;
          ptls_log._generation = ptls_log._generation + 1;
          iVar4 = 0;
          bVar3 = true;
          goto LAB_00114e9f;
        }
      }
      bVar3 = false;
      goto LAB_00114e9f;
    }
  }
  __ptr_01 = (void *)0x0;
  bVar3 = false;
  iVar4 = 0x201;
LAB_00114e9f:
  pthread_mutex_unlock((pthread_mutex_t *)&logctx.mutex);
  if (!bVar3) {
    free(__ptr);
    free(__ptr_00);
    free(__ptr_01);
  }
  return iVar4;
}

Assistant:

int ptls_log_add_fd(int fd, float sample_ratio, const char *_points, const char *_snis, const char *_addresses, int appdata)
{
#if PTLS_HAVE_LOG

    char *points = NULL, *snis = NULL;
    struct in6_addr *addresses = NULL;
    int ret;

    pthread_mutex_lock(&logctx.mutex);

    if ((points = duplicate_stringlist(_points)) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }
    if ((snis = duplicate_stringlist(_snis)) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }
    {
        size_t num_addresses = 0;
        for (const char *input = _addresses; input != NULL && *input != '\0'; input += strlen(input) + 1)
            ++num_addresses;
        if ((addresses = malloc(sizeof(*addresses) * (num_addresses + 1))) == NULL) {
            ret = PTLS_ERROR_NO_MEMORY;
            goto Exit;
        }
        size_t index = 0;
        for (const char *input = _addresses; input != NULL && *input != '\0'; input += strlen(input) + 1) {
            /* note: for consistency to the handling of points, erroneous input is ignored. V4 addresses will use the mapped form
             * (::ffff:192.0.2.1) */
            if (!inet_pton(AF_INET6, input, &addresses[index])) {
                struct in_addr v4;
                if (!inet_pton(AF_INET, input, &v4))
                    continue;
                ptls_build_v4_mapped_v6_address(&addresses[index], &v4);
            }
            if (memcmp(&addresses[index], &in6addr_any, sizeof(struct in6_addr)) == 0)
                continue;
            ++index;
        }
        addresses[index] = in6addr_any;
    }

    /* find slot, or return if not available */
    size_t slot_index;
    for (slot_index = 0; slot_index < PTLS_ELEMENTSOF(logctx.conns); ++slot_index)
        if (logctx.conns[slot_index].points == NULL)
            break;
    if (slot_index == PTLS_ELEMENTSOF(logctx.conns)) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }

    /* setup the slot */
    logctx.conns[slot_index].fd = fd;
    logctx.conns[slot_index].points = points;
    logctx.conns[slot_index].snis = snis;
    logctx.conns[slot_index].addresses = addresses;
    logctx.conns[slot_index].sample_ratio = sample_ratio;
    logctx.conns[slot_index].appdata = appdata;
    ++ptls_log._generation;

    ret = 0; /* success */

Exit:
    pthread_mutex_unlock(&logctx.mutex);
    if (ret != 0) {
        free(points);
        free(snis);
        free(addresses);
    }
    return ret;

#else
    return PTLS_ERROR_NOT_AVAILABLE;
#endif
}